

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stair_shuffle.c
# Opt level: O3

void stair_shuffle(dw_rom *rom)

{
  dungeon_map *pdVar1;
  dw_warp *pdVar2;
  dw_map_meta *pdVar3;
  dw_warp *pdVar4;
  byte bVar5;
  uint8_t uVar6;
  dw_dungeon_tile dVar7;
  dungeon_map *pdVar8;
  dw_warp *pdVar9;
  uint8_t uVar10;
  uint8_t (*pauVar11) [30];
  uint8_t (*pauVar12) [30];
  size_t i;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  dungeon_map *pdVar16;
  dw_warp *pdVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  dw_map_index dVar21;
  dungeon_map *pdVar22;
  size_t j;
  byte *pbVar23;
  ulong uVar24;
  uint8_t (*local_50) [30];
  
  pdVar8 = (dungeon_map *)calloc(0x11,0x387);
  maps = pdVar8;
  pdVar9 = (dw_warp *)calloc(0x50,3);
  warps_to = pdVar9 + 0xf;
  pdVar2 = (rom->map).warps_from;
  uVar13 = 0;
  lVar14 = 0;
  warps_from = pdVar9;
LAB_00168a9f:
  uVar18 = uVar13 - 0x33;
  if (uVar13 < 0x33) {
    uVar18 = uVar13;
  }
  dVar21 = CHARLOCK;
  lVar19 = 0;
  do {
    if (dVar21 == pdVar2[uVar18].map) {
      dVar21 = CHARLOCK;
      lVar19 = 0;
      goto LAB_00168ae6;
    }
    dVar21 = indexes[lVar19 + 1];
    lVar19 = lVar19 + 1;
  } while (lVar19 != 0x10);
  goto LAB_00168b1a;
  while( true ) {
    dVar21 = indexes[lVar19 + 1];
    lVar19 = lVar19 + 1;
    if (lVar19 == 0x10) break;
LAB_00168ae6:
    if (dVar21 == (rom->map).warps_to[uVar18].map) {
      pdVar9[lVar14].y = pdVar2[uVar13].y;
      uVar6 = pdVar2[uVar13].x;
      pdVar9[lVar14].map = pdVar2[uVar13].map;
      pdVar9[lVar14].x = uVar6;
      lVar14 = lVar14 + 1;
      break;
    }
  }
LAB_00168b1a:
  if (uVar13 == 0x33) {
    warps_to = pdVar9 + lVar14;
  }
  uVar13 = uVar13 + 1;
  if (uVar13 == 0x66) goto code_r0x00168b3b;
  goto LAB_00168a9f;
  while( true ) {
    dVar21 = indexes[lVar20 + 1];
    lVar20 = lVar20 + 1;
    if (lVar20 == 0x10) break;
LAB_0016910c:
    if (dVar21 == (rom->map).warps_to[lVar14].map) {
      pdVar17->y = pdVar2[lVar19].y;
      pdVar4 = pdVar2 + lVar19;
      uVar6 = pdVar4->x;
      pdVar17->map = pdVar4->map;
      pdVar17->x = uVar6;
      pdVar17 = (rom->map).warps_to;
      pdVar17[lVar14].y = pdVar9[lVar19].y;
      pdVar4 = pdVar9 + lVar19;
      uVar6 = pdVar4->x;
      pdVar17 = pdVar17 + lVar14;
      pdVar17->map = pdVar4->map;
      pdVar17->x = uVar6;
      lVar19 = lVar19 + 1;
      break;
    }
  }
LAB_00169155:
  lVar14 = lVar14 + 1;
  if (lVar14 == 0x33) goto LAB_00169162;
  goto LAB_001690c6;
code_r0x00168b3b:
  pdVar3 = (rom->map).meta;
  local_50 = pdVar8->tiles + 1;
  uVar13 = 0;
  do {
    dVar21 = indexes[uVar13];
    pdVar8[uVar13].index = (byte)dVar21;
    bVar5 = pdVar3[dVar21].width + 1;
    uVar18 = (ulong)bVar5;
    pdVar8[uVar13].width = bVar5;
    bVar5 = pdVar3[dVar21].height + 1;
    uVar15 = (ulong)bVar5;
    pdVar8[uVar13].height = bVar5;
    if (uVar13 < 2) {
      if (bVar5 != 0) {
        pbVar23 = rom->content + (*(ushort *)pdVar3[(byte)dVar21].pointer & 0x7fff);
        uVar24 = 0;
        pauVar12 = local_50;
        do {
          if ((char)uVar18 == '\0') {
            uVar18 = 0;
          }
          else {
            uVar15 = 0;
            pauVar11 = pauVar12;
            do {
              dVar7 = translate_town_tile((uint)(*pbVar23 >> 4));
              pauVar11[-1][0] = (uint8_t)dVar7;
              dVar7 = translate_town_tile(*pbVar23 & TOWN_TILE_COUNTER);
              (*pauVar11)[0] = (uint8_t)dVar7;
              pbVar23 = pbVar23 + 1;
              uVar15 = uVar15 + 2;
              uVar18 = (ulong)pdVar8[uVar13].width;
              pauVar11 = pauVar11 + 2;
            } while (uVar15 < uVar18);
            uVar15 = (ulong)pdVar8[uVar13].height;
          }
          uVar24 = uVar24 + 1;
          pauVar12 = (uint8_t (*) [30])(*pauVar12 + 1);
        } while (uVar24 < uVar15);
      }
    }
    else if (bVar5 != 0) {
      pbVar23 = rom->content + (*(ushort *)pdVar3[dVar21 & 0xff].pointer & 0x7fff);
      uVar24 = 0;
      pauVar12 = local_50;
      do {
        if ((char)uVar18 == '\0') {
          uVar18 = 0;
        }
        else {
          uVar15 = 0;
          pauVar11 = pauVar12;
          do {
            pauVar11[-1][0] = *pbVar23 >> 4 & 7;
            (*pauVar11)[0] = *pbVar23 & 7;
            pbVar23 = pbVar23 + 1;
            uVar15 = uVar15 + 2;
            uVar18 = (ulong)pdVar8[uVar13].width;
            pauVar11 = pauVar11 + 2;
          } while (uVar15 < uVar18);
          uVar15 = (ulong)pdVar8[uVar13].height;
        }
        uVar24 = uVar24 + 1;
        pauVar12 = (uint8_t (*) [30])(*pauVar12 + 1);
      } while (uVar24 < uVar15);
    }
    uVar13 = uVar13 + 1;
    local_50 = (uint8_t (*) [30])((long)(local_50 + 0x1e) + 3);
  } while (uVar13 != 0x10);
  rom->chest_access[0xf] = '\0';
  rom->chest_access[0x10] = '\0';
  rom->chest_access[0x11] = '\0';
  rom->chest_access[0x12] = '\0';
  rom->chest_access[0x13] = '\0';
  rom->chest_access[0x14] = '\0';
  rom->chest_access[0x15] = '\0';
  rom->chest_access[0x16] = '\0';
  rom->chest_access[0x17] = '\0';
  rom->chest_access[0x18] = '\0';
  rom->chest_access[0x19] = '\0';
  rom->chest_access[0x1a] = '\0';
  rom->chest_access[0x1b] = '\0';
  rom->chest_access[0x1c] = '\0';
  rom->chest_access[0x1d] = '\0';
  rom->chest_access[0x1e] = '\0';
  rom->chest_access[0] = '\0';
  rom->chest_access[1] = '\0';
  rom->chest_access[2] = '\0';
  rom->chest_access[3] = '\0';
  rom->chest_access[4] = '\0';
  rom->chest_access[5] = '\0';
  rom->chest_access[6] = '\0';
  rom->chest_access[7] = '\0';
  rom->chest_access[8] = '\0';
  rom->chest_access[9] = '\0';
  rom->chest_access[10] = '\0';
  rom->chest_access[0xb] = '\0';
  rom->chest_access[0xc] = '\0';
  rom->chest_access[0xd] = '\0';
  rom->chest_access[0xe] = '\0';
  rom->chest_access[0xf] = '\0';
  (rom->map).key_access = '\0';
  if ((rom->flags[2] & 0xc) != 0) {
    puts("Shuffling stairs...");
    uVar6 = maps->index;
    pdVar8 = maps;
    uVar10 = uVar6;
    if (uVar6 == '\0') {
      pdVar8 = (dungeon_map *)0x0;
    }
    else {
      do {
        pdVar22 = maps;
        if (uVar10 == '\x02') goto LAB_00168d16;
        pdVar16 = pdVar8 + 1;
        pdVar8 = pdVar8 + 1;
        uVar10 = pdVar16->index;
      } while (pdVar16->index != '\0');
      pdVar8 = (dungeon_map *)0x0;
LAB_00168d16:
      do {
        if (uVar6 == '\x06') goto LAB_00168d3f;
        uVar6 = pdVar22[1].index;
        pdVar22 = pdVar22 + 1;
      } while (uVar6 != '\0');
    }
    pdVar22 = (dungeon_map *)0x0;
LAB_00168d3f:
    do {
      do {
        clear_all_flags();
        mt_shuffle(warps_from,((long)warps_to - (long)warps_from) * 0x5555555555555556,3);
        uVar6 = maps->index;
        pdVar16 = maps;
        while (uVar6 != '\0') {
          if (uVar6 == '\x18') goto LAB_00168d85;
          pdVar1 = pdVar16 + 1;
          pdVar16 = pdVar16 + 1;
          uVar6 = pdVar1->index;
        }
        pdVar16 = (dungeon_map *)0x0;
LAB_00168d85:
        map_dungeon(pdVar16,'\x06','\v',TRUE);
        uVar6 = maps->index;
        pdVar16 = maps;
        while (uVar6 != '\0') {
          if (uVar6 == '\x16') goto LAB_00168dbb;
          pdVar1 = pdVar16 + 1;
          pdVar16 = pdVar16 + 1;
          uVar6 = pdVar1->index;
        }
        pdVar16 = (dungeon_map *)0x0;
LAB_00168dbb:
        map_dungeon(pdVar16,'\x06','\x05',TRUE);
        uVar6 = maps->index;
        pdVar16 = maps;
        while (uVar6 != '\0') {
          if (uVar6 == '\x1c') goto LAB_00168df1;
          pdVar1 = pdVar16 + 1;
          pdVar16 = pdVar16 + 1;
          uVar6 = pdVar1->index;
        }
        pdVar16 = (dungeon_map *)0x0;
LAB_00168df1:
        map_dungeon(pdVar16,'\0','\0',TRUE);
      } while (((rom->flags[7] & 3) == 0) &&
              (((pdVar8->tiles[10][0x13] | pdVar22->tiles[10][0x1d]) & 8) != 0));
      uVar6 = maps->index;
      pdVar16 = maps;
      while (uVar6 != '\0') {
        if (uVar6 == '\x06') goto LAB_00168e3e;
        pdVar1 = pdVar16 + 1;
        pdVar16 = pdVar16 + 1;
        uVar6 = pdVar1->index;
      }
      pdVar16 = (dungeon_map *)0x0;
LAB_00168e3e:
      map_dungeon(pdVar16,'\n','\x1d',TRUE);
      pauVar12 = maps->tiles;
      lVar14 = 0;
      do {
        uVar13 = (ulong)maps[lVar14].width;
        if (uVar13 != 0) {
          uVar18 = 0;
          pauVar11 = pauVar12;
          do {
            uVar15 = 0;
            do {
              if ((*pauVar11)[uVar15] == '\x04') goto LAB_00168d3f;
              uVar15 = uVar15 + 1;
            } while (uVar13 != uVar15);
            uVar18 = uVar18 + 1;
            pauVar11 = pauVar11 + 1;
          } while (uVar18 != uVar13);
        }
        lVar14 = lVar14 + 1;
        pauVar12 = (uint8_t (*) [30])((long)(pauVar12 + 0x1e) + 3);
      } while (lVar14 != 0x10);
      if ((rom->flags[7] & 3) != 0) break;
      clear_all_flags();
      map_dungeon(pdVar8,'\n','\x13',TRUE);
    } while ((pdVar22->tiles[10][0x1d] & 8) == 0);
    lVar19 = 0;
    vpatch(rom,0xd95e,3,0x20,0xb5,0xda);
    vpatch(rom,0xd9be,9,0xf0,7,0xc9,3,0xf0,3,0x4c,0xc6,0xda);
    vpatch(rom,0xda06,0xb,0x4c,0x3d,0xd9,0xff,0xff,0xff,0xff,0xff,0xff,0xff,0xff);
    vpatch(rom,0xdaa5,0x3e,0xc9,6,0xf0,4,0xc9,0xf,0x90,0xa8,0xae,0x2f,0x66,0xa9,2,0x4c,0xe2,0xd9,
           0xa5,0x45,0xc9,2,0xf0,7,0xc9,0xf,0xb0,3,0x8e,0x2f,0x66,0xbd,0x61,0xf4,0x60,0x20,0xf0,0xc6
           ,2,0x20,0xcb,199,0xd,0x4c,0xd9,0xcf,0xff,0xff,0xff,0xff,0xff,0xff,0xff,0xff,0xff,0xff,
           0xff,0xff,0xff,0xff,0xff,0xff,0xff,0xff);
    pdVar9 = warps_to;
    pdVar2 = warps_from;
    lVar14 = 0;
LAB_001690c6:
    pdVar4 = (rom->map).warps_from;
    pdVar17 = pdVar4 + lVar14;
    dVar21 = CHARLOCK;
    lVar20 = 0;
    do {
      if (dVar21 == pdVar4[lVar14].map) {
        dVar21 = CHARLOCK;
        lVar20 = 0;
        goto LAB_0016910c;
      }
      dVar21 = indexes[lVar20 + 1];
      lVar20 = lVar20 + 1;
    } while (lVar20 != 0x10);
    goto LAB_00169155;
  }
LAB_00169162:
  puts("Mapping Dungeons...");
  pdVar8 = maps;
  clear_all_flags();
  uVar6 = pdVar8->index;
  while (uVar6 != '\0') {
    if (uVar6 == '\x1c') goto LAB_00169198;
    pdVar22 = pdVar8 + 1;
    pdVar8 = pdVar8 + 1;
    uVar6 = pdVar22->index;
  }
  pdVar8 = (dungeon_map *)0x0;
LAB_00169198:
  map_dungeon(pdVar8,'\0','\0',FALSE);
  mark_chests(rom,'\x01');
  clear_all_flags();
  uVar6 = maps->index;
  pdVar8 = maps;
  while (uVar6 != '\0') {
    if (uVar6 == '\x1c') goto LAB_001691da;
    pdVar22 = pdVar8 + 1;
    pdVar8 = pdVar8 + 1;
    uVar6 = pdVar22->index;
  }
  pdVar8 = (dungeon_map *)0x0;
LAB_001691da:
  map_dungeon(pdVar8,'\0','\0',TRUE);
  mark_chests(rom,'\x10');
  clear_all_flags();
  uVar6 = maps->index;
  pdVar8 = maps;
  while (uVar6 != '\0') {
    if (uVar6 == '\x16') goto LAB_0016921c;
    pdVar22 = pdVar8 + 1;
    pdVar8 = pdVar8 + 1;
    uVar6 = pdVar22->index;
  }
  pdVar8 = (dungeon_map *)0x0;
LAB_0016921c:
  map_dungeon(pdVar8,'\x06','\x05',FALSE);
  mark_chests(rom,'\x02');
  clear_all_flags();
  uVar6 = maps->index;
  pdVar8 = maps;
  while (uVar6 != '\0') {
    if (uVar6 == '\x16') goto LAB_00169261;
    pdVar22 = pdVar8 + 1;
    pdVar8 = pdVar8 + 1;
    uVar6 = pdVar22->index;
  }
  pdVar8 = (dungeon_map *)0x0;
LAB_00169261:
  map_dungeon(pdVar8,'\x06','\x05',TRUE);
  mark_chests(rom,' ');
  clear_all_flags();
  uVar6 = maps->index;
  pdVar8 = maps;
  while (uVar6 != '\0') {
    if (uVar6 == '\x18') goto LAB_001692a9;
    pdVar22 = pdVar8 + 1;
    pdVar8 = pdVar8 + 1;
    uVar6 = pdVar22->index;
  }
  pdVar8 = (dungeon_map *)0x0;
LAB_001692a9:
  map_dungeon(pdVar8,'\x06','\v',FALSE);
  mark_chests(rom,'\x04');
  clear_all_flags();
  uVar6 = maps->index;
  pdVar8 = maps;
  while (uVar6 != '\0') {
    if (uVar6 == '\x18') goto LAB_001692ee;
    pdVar22 = pdVar8 + 1;
    pdVar8 = pdVar8 + 1;
    uVar6 = pdVar22->index;
  }
  pdVar8 = (dungeon_map *)0x0;
LAB_001692ee:
  map_dungeon(pdVar8,'\x06','\v',TRUE);
  mark_chests(rom,'@');
  clear_all_flags();
  uVar6 = maps->index;
  pdVar8 = maps;
  while (uVar6 != '\0') {
    if (uVar6 == '\x06') goto LAB_00169336;
    pdVar22 = pdVar8 + 1;
    pdVar8 = pdVar8 + 1;
    uVar6 = pdVar22->index;
  }
  pdVar8 = (dungeon_map *)0x0;
LAB_00169336:
  map_dungeon(pdVar8,'\n','\x13',FALSE);
  mark_chests(rom,'\b');
  clear_all_flags();
  uVar6 = maps->index;
  pdVar8 = maps;
  while (uVar6 != '\0') {
    if (uVar6 == '\x06') goto LAB_0016937b;
    pdVar22 = pdVar8 + 1;
    pdVar8 = pdVar8 + 1;
    uVar6 = pdVar22->index;
  }
  pdVar8 = (dungeon_map *)0x0;
LAB_0016937b:
  map_dungeon(pdVar8,'\n','\x13',TRUE);
  mark_chests(rom,0x80);
  return;
}

Assistant:

void stair_shuffle(dw_rom *rom)
{

    stair_shuffle_init(rom);
    if (STAIR_SHUFFLE(rom)) {
        printf("Shuffling stairs...\n");
        do_shuffle(rom);
        code_patches(rom);
        write_back_warps(rom);
    }
    chest_paths(rom);

}